

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O0

sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::push_sequence(sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this,size_t count,
               sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *t)

{
  ulong in_RSI;
  long in_RDI;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptr;
  size_t size_left;
  undefined8 local_8;
  
  if ((ulong)((*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10)) / 0x28) < in_RSI) {
    local_8 = grow_(this,count,t);
  }
  else {
    local_8 = *(sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                **)(in_RDI + 0x10);
    *(ulong *)(in_RDI + 0x10) = in_RSI * 0x28 + *(long *)(in_RDI + 0x10);
  }
  return local_8;
}

Assistant:

T *push_sequence(std::size_t count, T const &t)
    {
        // Check to see if we have overflowed this buffer
        std::size_t size_left = static_cast< std::size_t >(this->end_ - this->curr_);
        if (size_left < count)
        {
            // allocate a new block and return a ptr to the new memory
            return this->grow_(count, t);
        }

        // This is the ptr to return
        T *ptr = this->curr_;

        // Advance the high-water mark
        this->curr_ += count;

        return ptr;
    }